

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *g;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  
  if ((flags & 0x300U) != 0) {
    __assert_fail("(flags & (ImGuiHoveredFlags_AllowWhenOverlapped | ImGuiHoveredFlags_AllowWhenDisabled)) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1b91,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
  }
  pIVar2 = GImGui->HoveredWindow;
  if (pIVar2 == (ImGuiWindow *)0x0) {
    return false;
  }
  if ((flags & 4U) == 0) {
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3 == (ImGuiWindow *)0x0) {
      __assert_fail("cur_window",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x1b9a,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
    }
    pIVar4 = pIVar3;
    if ((flags & 2U) != 0) {
      do {
        pIVar3 = pIVar4;
        pIVar4 = pIVar3->RootWindow;
        if ((flags & 8U) == 0) {
          pIVar4 = pIVar4->RootWindowPopupTree;
        }
      } while (pIVar3 != pIVar4);
    }
    pIVar4 = pIVar2;
    if ((flags & 1U) == 0) {
      if (pIVar2 != pIVar3) {
        return false;
      }
    }
    else {
      do {
        pIVar5 = pIVar4;
        pIVar4 = pIVar5->RootWindow;
        if ((flags & 8U) == 0) {
          pIVar4 = pIVar4->RootWindowPopupTree;
        }
      } while (pIVar5 != pIVar4);
      pIVar4 = pIVar2;
      if (pIVar5 != pIVar3) {
        while (pIVar4 != pIVar3) {
          if (pIVar4 == pIVar5) {
            return false;
          }
          ppIVar1 = &pIVar4->ParentWindow;
          pIVar4 = *ppIVar1;
          if (*ppIVar1 == (ImGuiWindow *)0x0) {
            return false;
          }
        }
      }
    }
  }
  if ((((((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar3 = GImGui->NavWindow->RootWindow, pIVar3 == (ImGuiWindow *)0x0)) ||
        (pIVar3->WasActive != true)) || (pIVar3 == pIVar2->RootWindow)) ||
      ((((uint)pIVar3->Flags >> 0x1b & 1) == 0 &&
       (((flags & 0x20U) != 0 || ((pIVar3->Flags & 0x4000000U) == 0)))))) &&
     (((char)flags < '\0' ||
      (((GImGui->ActiveId == 0 || (GImGui->ActiveIdAllowOverlap != false)) ||
       (GImGui->ActiveId == pIVar2->MoveId)))))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & (ImGuiHoveredFlags_AllowWhenOverlapped | ImGuiHoveredFlags_AllowWhenDisabled)) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.HoveredWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;
    if (ref_window == NULL)
        return false;

    if ((flags & ImGuiHoveredFlags_AnyWindow) == 0)
    {
        IM_ASSERT(cur_window); // Not inside a Begin()/End()
        const bool popup_hierarchy = (flags & ImGuiHoveredFlags_NoPopupHierarchy) == 0;
        if (flags & ImGuiHoveredFlags_RootWindow)
            cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy);

        bool result;
        if (flags & ImGuiHoveredFlags_ChildWindows)
            result = IsWindowChildOf(ref_window, cur_window, popup_hierarchy);
        else
            result = (ref_window == cur_window);
        if (!result)
            return false;
    }

    if (!IsWindowContentHoverable(ref_window, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != ref_window->MoveId)
            return false;
    return true;
}